

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

size_t __thiscall c4::yml::Tree::first_child(Tree *this,size_t node)

{
  NodeData *pNVar1;
  
  pNVar1 = _p(this,node);
  return pNVar1->m_first_child;
}

Assistant:

size_t first_child(size_t node) const { return _p(node)->m_first_child; }